

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_translate(bcf_hdr_t *dst_hdr,bcf_hdr_t *src_hdr,bcf1_t *line)

{
  uint uVar1;
  uint uVar2;
  char *__s1;
  char *__s2;
  bcf_info_t *pbVar3;
  bcf_fmt_t *pbVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 uVar11;
  int dict;
  long lVar12;
  long lVar13;
  long lVar14;
  kstring_t str;
  
  if (line->errcode != 0) {
    fprintf(_stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x8e6,"bcf_translate");
    exit(1);
  }
  if (src_hdr->ntransl != -1) {
    if (src_hdr->ntransl == 0) {
      iVar7 = 0;
      for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
        uVar10 = (ulong)src_hdr->n[lVar12];
        piVar8 = (int *)malloc(uVar10 << 2);
        src_hdr->transl[lVar12] = piVar8;
        lVar13 = 0;
        for (lVar14 = 0; lVar14 < (int)uVar10; lVar14 = lVar14 + 1) {
          __s1 = *(char **)((long)&src_hdr->id[lVar12]->key + lVar13 * 4);
          if ((__s1 == (char *)0x0) ||
             (__s2 = *(char **)((long)&dst_hdr->id[lVar12]->key + lVar13 * 4), __s2 == (char *)0x0))
          {
            *(undefined4 *)((long)piVar8 + lVar13) = 0xffffffff;
          }
          else if ((lVar14 < dst_hdr->n[lVar12]) && (iVar6 = strcmp(__s1,__s2), iVar6 == 0)) {
            *(undefined4 *)((long)piVar8 + lVar13) = 0xffffffff;
          }
          else {
            iVar6 = bcf_hdr_id2int(dst_hdr,(int)lVar12,__s1);
            *(int *)((long)piVar8 + lVar13) = iVar6;
            iVar7 = iVar7 + 1;
            src_hdr->ntransl = iVar7;
            uVar10 = (ulong)(uint)src_hdr->n[lVar12];
          }
          lVar13 = lVar13 + 4;
        }
      }
      if (iVar7 == -1) {
        return 0;
      }
      if (iVar7 == 0) {
        free(src_hdr->transl[0]);
        src_hdr->transl[0] = (int *)0x0;
        free(src_hdr->transl[1]);
        src_hdr->transl[1] = (int *)0x0;
        src_hdr->ntransl = -1;
        return 0;
      }
    }
    bcf_unpack(line,0xf);
    if (-1 < src_hdr->transl[1][line->rid]) {
      line->rid = src_hdr->transl[1][line->rid];
    }
    for (lVar12 = 0; lVar12 < (line->d).n_flt; lVar12 = lVar12 + 1) {
      piVar8 = (line->d).flt;
      if (-1 < src_hdr->transl[0][piVar8[lVar12]]) {
        piVar8[lVar12] = src_hdr->transl[0][piVar8[lVar12]];
      }
      piVar8 = &(line->d).shared_dirty;
      *(byte *)piVar8 = (byte)*piVar8 | 4;
    }
    lVar12 = 0x1c;
    uVar10 = 0;
    while( true ) {
      uVar9 = *(ulong *)&line->field_0x10;
      if ((uVar9 & 0xffff) <= uVar10) break;
      pbVar3 = (line->d).info;
      uVar1 = *(uint *)((long)pbVar3 + lVar12 + -0x1c);
      uVar2 = src_hdr->transl[0][(int)uVar1];
      if (-1 < (int)uVar2) {
        iVar7 = 3 - (uint)(uVar2 < 0x8000);
        if (uVar2 < 0x80) {
          iVar7 = 1;
        }
        bVar5 = uVar2 < 0x80;
        if (0x7f < uVar1) {
          bVar5 = 3 - (uint)(uVar1 < 0x8000) == iVar7;
        }
        if (bVar5) {
          *(uint *)((long)pbVar3 + lVar12 + -0x1c) = uVar2;
          lVar13 = *(long *)((long)pbVar3 + lVar12 + -0xc);
          lVar14 = -(ulong)(*(uint *)((long)&pbVar3->key + lVar12) & 0x7fffffff);
          if (iVar7 == 2) {
            *(short *)(lVar13 + lVar14) = (short)uVar2;
          }
          else if (iVar7 == 1) {
            *(char *)(lVar13 + 1 + lVar14) = (char)uVar2;
          }
          else {
            *(uint *)(lVar13 + lVar14) = uVar2;
          }
        }
        else {
          if (*(int *)((long)&pbVar3->key + lVar12) < 0) {
            __assert_fail("!info->vptr_free",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x926,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
          }
          str.l = 0;
          str.m = 0;
          str.s = (char *)0x0;
          bcf_enc_int1(&str,uVar2);
          bcf_enc_size(&str,*(int *)((long)pbVar3 + lVar12 + -0x14),
                       *(int *)((long)pbVar3 + lVar12 + -0x18));
          *(uint *)((long)&pbVar3->key + lVar12) =
               *(uint *)((long)&pbVar3->key + lVar12) & 0x80000000 | (uint)str.l & 0x7fffffff;
          kputsn(*(char **)((long)pbVar3 + lVar12 + -0xc),*(int *)((long)pbVar3 + lVar12 + -4),&str)
          ;
          uVar1 = *(uint *)((long)&pbVar3->key + lVar12);
          *(char **)((long)pbVar3 + lVar12 + -0xc) = str.s + (uVar1 & 0x7fffffff);
          *(uint *)((long)&pbVar3->key + lVar12) = uVar1 | 0x80000000;
          *(uint *)((long)pbVar3 + lVar12 + -0x1c) = uVar2;
          piVar8 = &(line->d).shared_dirty;
          *(byte *)piVar8 = (byte)*piVar8 | 8;
        }
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x20;
    }
    lVar12 = 0x1c;
    uVar10 = 0;
    do {
      if ((uVar9 >> 0x20 & 0xff) <= uVar10) {
        return 0;
      }
      pbVar4 = (line->d).fmt;
      uVar1 = *(uint *)((long)pbVar4 + lVar12 + -0x1c);
      uVar2 = src_hdr->transl[0][(int)uVar1];
      if (-1 < (int)uVar2) {
        iVar7 = 3 - (uint)(uVar2 < 0x8000);
        if (uVar2 < 0x80) {
          iVar7 = 1;
        }
        bVar5 = uVar2 < 0x80;
        if (0x7f < uVar1) {
          bVar5 = 3 - (uint)(uVar1 < 0x8000) == iVar7;
        }
        if (bVar5) {
          *(uint *)((long)pbVar4 + lVar12 + -0x1c) = uVar2;
          lVar13 = *(long *)((long)pbVar4 + lVar12 + -0xc);
          uVar9 = (ulong)(*(uint *)((long)&pbVar4->id + lVar12) & 0x7fffffff);
          *(char *)((lVar13 - uVar9) + 1) = (char)uVar2;
          if (iVar7 != 1) {
            lVar14 = -uVar9;
            uVar11 = (undefined1)(uVar2 >> 8);
            if (iVar7 == 2) {
              *(undefined1 *)(lVar13 + 2 + lVar14) = uVar11;
            }
            else {
              *(undefined1 *)(lVar13 + 2 + lVar14) = uVar11;
              *(char *)(lVar13 + 3 + lVar14) = (char)(uVar2 >> 0x10);
              *(char *)(lVar13 + 4 + lVar14) = (char)(uVar2 >> 0x18);
            }
          }
        }
        else {
          if (*(int *)((long)&pbVar4->id + lVar12) < 0) {
            __assert_fail("!fmt->p_free",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                          ,0x946,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
          }
          str.l = 0;
          str.m = 0;
          str.s = (char *)0x0;
          bcf_enc_int1(&str,uVar2);
          bcf_enc_size(&str,*(int *)((long)pbVar4 + lVar12 + -0x18),
                       *(int *)((long)pbVar4 + lVar12 + -0x10));
          *(uint *)((long)&pbVar4->id + lVar12) =
               *(uint *)((long)&pbVar4->id + lVar12) & 0x80000000 | (uint)str.l & 0x7fffffff;
          kputsn(*(char **)((long)pbVar4 + lVar12 + -0xc),*(int *)((long)pbVar4 + lVar12 + -4),&str)
          ;
          uVar1 = *(uint *)((long)&pbVar4->id + lVar12);
          *(char **)((long)pbVar4 + lVar12 + -0xc) = str.s + (uVar1 & 0x7fffffff);
          *(uint *)((long)&pbVar4->id + lVar12) = uVar1 | 0x80000000;
          *(uint *)((long)pbVar4 + lVar12 + -0x1c) = uVar2;
          (line->d).indiv_dirty = 1;
        }
      }
      uVar10 = uVar10 + 1;
      uVar9 = *(ulong *)&line->field_0x10;
      lVar12 = lVar12 + 0x20;
    } while( true );
  }
  return 0;
}

Assistant:

int bcf_translate(const bcf_hdr_t *dst_hdr, bcf_hdr_t *src_hdr, bcf1_t *line)
{
    int i;
    if ( line->errcode )
    {
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,line->errcode);
        exit(1);
    }
    if ( src_hdr->ntransl==-1 ) return 0;    // no need to translate, all tags have the same id
    if ( !src_hdr->ntransl )  // called for the first time, see what needs translating
    {
        int dict;
        for (dict=0; dict<2; dict++)    // BCF_DT_ID and BCF_DT_CTG
        {
            src_hdr->transl[dict] = (int*) malloc(src_hdr->n[dict]*sizeof(int));
            for (i=0; i<src_hdr->n[dict]; i++)
            {
                if ( !src_hdr->id[dict][i].key || !dst_hdr->id[dict][i].key )    // gap left after removed BCF header lines
                    src_hdr->transl[dict][i] = -1;
                else if ( i>=dst_hdr->n[dict] || strcmp(src_hdr->id[dict][i].key,dst_hdr->id[dict][i].key) )
                {
                    src_hdr->transl[dict][i] = bcf_hdr_id2int(dst_hdr,dict,src_hdr->id[dict][i].key);
                    src_hdr->ntransl++;
                }
                else
                    src_hdr->transl[dict][i] = -1;
            }
        }
        if ( !src_hdr->ntransl )
        {
            free(src_hdr->transl[0]); src_hdr->transl[0] = NULL;
            free(src_hdr->transl[1]); src_hdr->transl[1] = NULL;
            src_hdr->ntransl = -1;
        }
        if ( src_hdr->ntransl==-1 ) return 0;
    }
    bcf_unpack(line,BCF_UN_ALL);

    // CHROM
    if ( src_hdr->transl[BCF_DT_CTG][line->rid] >=0 ) line->rid = src_hdr->transl[BCF_DT_CTG][line->rid];

    // FILTER
    for (i=0; i<line->d.n_flt; i++)
    {
        int src_id = line->d.flt[i];
        if ( src_hdr->transl[BCF_DT_ID][src_id] >=0 )
            line->d.flt[i] = src_hdr->transl[BCF_DT_ID][src_id];
        line->d.shared_dirty |= BCF1_DIRTY_FLT;
    }

    // INFO
    for (i=0; i<line->n_info; i++)
    {
        int src_id = line->d.info[i].key;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.info[i].key = dst_id;
            uint8_t *vptr = line->d.info[i].vptr - line->d.info[i].vptr_off;
            if ( dst_size==BCF_BT_INT8 ) { vptr[1] = (uint8_t)dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { *(uint16_t*)vptr = (uint16_t)dst_id; }
            else { *(uint32_t*)vptr = (uint32_t)dst_id; }
        }
        else    // must realloc
        {
            bcf_info_t *info = &line->d.info[i];
            assert( !info->vptr_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, info->len,info->type);
            info->vptr_off = str.l;
            kputsn((char*)info->vptr, info->vptr_len, &str);
            info->vptr = (uint8_t*)str.s + info->vptr_off;
            info->vptr_free = 1;
            info->key = dst_id;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }

    // FORMAT
    for (i=0; i<line->n_fmt; i++)
    {
        int src_id = line->d.fmt[i].id;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.fmt[i].id = dst_id;
            uint8_t *p = line->d.fmt[i].p - line->d.fmt[i].p_off;    // pointer to the vector size (4bits) and BT type (4bits)
            if ( dst_size==BCF_BT_INT8 ) { p[1] = dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; }
            else { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; p[3] = x[2]; p[4] = x[3]; }
        }
        else    // must realloc
        {
            bcf_fmt_t *fmt = &line->d.fmt[i];
            assert( !fmt->p_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, fmt->n, fmt->type);
            fmt->p_off = str.l;
            kputsn((char*)fmt->p, fmt->p_len, &str);
            fmt->p = (uint8_t*)str.s + fmt->p_off;
            fmt->p_free = 1;
            fmt->id = dst_id;
            line->d.indiv_dirty = 1;
        }
    }
    return 0;
}